

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_mod_s_h_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  short sVar1;
  short sVar2;
  
  sVar2 = *(short *)((env->active_fpu).fpr + wt);
  sVar1 = (short)(env->active_fpu).fpr[ws].fs[0];
  if (sVar2 == -1 && sVar1 == -0x8000) {
    sVar1 = 0;
  }
  else if (sVar2 != 0) {
    sVar1 = sVar1 % sVar2;
  }
  *(short *)((env->active_fpu).fpr + wd) = sVar1;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
  if (sVar1 == -1 && sVar2 == -0x8000) {
    sVar2 = 0;
  }
  else if (sVar1 != 0) {
    sVar2 = sVar2 % sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = sVar2;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  sVar1 = (short)*(undefined4 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  if (sVar2 == -1 && sVar1 == -0x8000) {
    sVar1 = 0;
  }
  else if (sVar2 != 0) {
    sVar1 = sVar1 % sVar2;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = sVar1;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
  if (sVar1 == -1 && sVar2 == -0x8000) {
    sVar2 = 0;
  }
  else if (sVar1 != 0) {
    sVar2 = sVar2 % sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = sVar2;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  sVar1 = (short)*(undefined4 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  if (sVar2 == -1 && sVar1 == -0x8000) {
    sVar1 = 0;
  }
  else if (sVar2 != 0) {
    sVar1 = sVar1 % sVar2;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = sVar1;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
  if (sVar1 == -1 && sVar2 == -0x8000) {
    sVar2 = 0;
  }
  else if (sVar1 != 0) {
    sVar2 = sVar2 % sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = sVar2;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  sVar1 = (short)*(undefined4 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  if (sVar2 == -1 && sVar1 == -0x8000) {
    sVar1 = 0;
  }
  else if (sVar2 != 0) {
    sVar1 = sVar1 % sVar2;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = sVar1;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
  if (sVar1 == -1 && sVar2 == -0x8000) {
    sVar2 = 0;
  }
  else if (sVar1 != 0) {
    sVar2 = sVar2 % sVar1;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = sVar2;
  return;
}

Assistant:

void helper_msa_mod_s_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_mod_s_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_mod_s_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_mod_s_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_mod_s_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_mod_s_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_mod_s_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_mod_s_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_mod_s_df(DF_HALF, pws->h[7],  pwt->h[7]);
}